

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bitset.hpp
# Opt level: O1

size_type __thiscall
boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_do_find_from
          (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this,size_type first_block
          )

{
  pointer puVar1;
  long lVar2;
  int iVar3;
  size_type sVar4;
  ulong uVar5;
  size_type i;
  size_type sVar6;
  bool bVar7;
  
  puVar1 = (this->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (long)(this->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
  sVar4 = 0xffffffffffffffff;
  bVar7 = first_block < uVar5;
  if (first_block < uVar5) {
    if (puVar1[first_block] == 0) {
      sVar6 = first_block;
      do {
        if (uVar5 - 1 == sVar6) {
          return 0xffffffffffffffff;
        }
        first_block = sVar6 + 1;
        lVar2 = sVar6 + 1;
        sVar6 = first_block;
      } while (puVar1[lVar2] == 0);
      bVar7 = first_block < uVar5;
    }
    if (bVar7) {
      iVar3 = lowest_bit<unsigned_long>(puVar1[first_block]);
      sVar4 = (long)iVar3 + first_block * 0x40;
    }
  }
  return sVar4;
}

Assistant:

typename dynamic_bitset<Block, Allocator>::size_type
dynamic_bitset<Block, Allocator>::m_do_find_from(size_type first_block) const
{
    size_type i = first_block;

    // skip null blocks
    while (i < num_blocks() && m_bits[i] == 0)
        ++i;

    if (i >= num_blocks())
        return npos; // not found

    return i * bits_per_block + static_cast<size_type>(boost::lowest_bit(m_bits[i]));

}